

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::StartMouseMovingWindow(ImGuiWindow *window)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *in_RDI;
  ImVec2 IVar3;
  ImGuiWindow *in_stack_00000008;
  bool can_move_window;
  ImGuiID in_stack_00000014;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffd8;
  
  pIVar2 = GImGui;
  FocusWindow(window,g._4_4_);
  SetActiveID(in_stack_00000014,in_stack_00000008);
  pIVar2->NavDisableHighlight = true;
  IVar3 = ::operator-(in_stack_ffffffffffffffd8,(ImVec2 *)0x1e50de);
  pIVar2->ActiveIdClickOffset = IVar3;
  pIVar2->ActiveIdNoClearOnFocusLoss = true;
  SetActiveIdUsingAllKeyboardKeys();
  bVar1 = true;
  if (((in_RDI->Flags & 4U) != 0) || ((in_RDI->RootWindow->Flags & 4U) != 0)) {
    bVar1 = false;
  }
  if (bVar1) {
    pIVar2->MovingWindow = in_RDI;
  }
  return;
}

Assistant:

void ImGui::StartMouseMovingWindow(ImGuiWindow* window)
{
    // Set ActiveId even if the _NoMove flag is set. Without it, dragging away from a window with _NoMove would activate hover on other windows.
    // We _also_ call this when clicking in a window empty space when io.ConfigWindowsMoveFromTitleBarOnly is set, but clear g.MovingWindow afterward.
    // This is because we want ActiveId to be set even when the window is not permitted to move.
    ImGuiContext& g = *GImGui;
    FocusWindow(window);
    SetActiveID(window->MoveId, window);
    g.NavDisableHighlight = true;
    g.ActiveIdClickOffset = g.IO.MouseClickedPos[0] - window->RootWindow->Pos;
    g.ActiveIdNoClearOnFocusLoss = true;
    SetActiveIdUsingAllKeyboardKeys();

    bool can_move_window = true;
    if ((window->Flags & ImGuiWindowFlags_NoMove) || (window->RootWindow->Flags & ImGuiWindowFlags_NoMove))
        can_move_window = false;
    if (can_move_window)
        g.MovingWindow = window;
}